

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

void __thiscall Memory::HeapInfo::ResumeIdleDecommitNonLeaf(HeapInfo *this)

{
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::ResumeIdleDecommit
            ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              *)&this->recyclerPageAllocator);
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::ResumeIdleDecommit
            ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              *)&this->recyclerLargeBlockPageAllocator);
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::ResumeIdleDecommit
            ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              *)&this->recyclerWithBarrierPageAllocator);
  return;
}

Assistant:

void HeapInfo::ResumeIdleDecommitNonLeaf()
{
    ForEachNonLeafPageAllocator([](IdleDecommitPageAllocator * pageAlloc)
    {
        pageAlloc->ResumeIdleDecommit();
    });
}